

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

void __thiscall
duckdb::RowVersionManager::AppendVersionInfo
          (RowVersionManager *this,TransactionData transaction,idx_t count,idx_t row_group_start,
          idx_t row_group_end)

{
  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var1;
  _Alloc_hider _Var2;
  pointer pCVar3;
  reference pvVar4;
  pointer pCVar5;
  ChunkVectorInfo *this_01;
  InternalException *this_02;
  idx_t start;
  pointer __p;
  idx_t iVar6;
  long lVar7;
  long lVar8;
  idx_t end;
  ulong uVar9;
  optional_ptr<duckdb::ChunkVectorInfo,_true> new_info;
  string local_90;
  transaction_t local_70;
  unsigned_long local_68;
  idx_t local_60;
  transaction_t local_58;
  ulong local_50;
  long local_48;
  idx_t local_40;
  ulong local_38;
  
  ::std::mutex::lock(&this->version_lock);
  this->has_changes = true;
  uVar9 = row_group_end - 1 >> 0xb;
  FillVectorInfo(this,uVar9);
  local_38 = row_group_start >> 0xb;
  iVar6 = (idx_t)((uint)row_group_start & 0x7ff);
  local_40 = row_group_end - (row_group_end - 1 & 0xfffffffffffff800);
  this_00 = &this->vector_info;
  local_70 = transaction.transaction_id;
  local_58 = 0xfffffffffffffffe;
  lVar7 = local_38 << 0xb;
  local_48 = local_38 - uVar9;
  lVar8 = 0;
  local_60 = iVar6;
  local_50 = uVar9;
  do {
    uVar9 = local_38 + lVar8;
    if (local_50 < uVar9) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
    start = 0;
    if (lVar8 == 0) {
      start = iVar6;
    }
    end = 0x800;
    if (local_48 + lVar8 == 0) {
      end = local_40;
    }
    if ((start == 0) && (end == 0x800)) {
      new_info.ptr = (ChunkVectorInfo *)(this->start + lVar7);
      make_uniq<duckdb::ChunkConstantInfo,unsigned_long>
                ((duckdb *)&local_90,(unsigned_long *)&new_info);
      pCVar3 = unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
               ::operator->((unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                             *)&local_90);
      pCVar3->insert_id = local_70;
      pCVar3 = unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
               ::operator->((unique_ptr<duckdb::ChunkConstantInfo,_std::default_delete<duckdb::ChunkConstantInfo>,_true>
                             *)&local_90);
      _Var2._M_p = local_90._M_dataplus._M_p;
      pCVar3->delete_id = local_58;
      local_90._M_dataplus._M_p = (pointer)0x0;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
               ::get<true>(this_00,uVar9);
      _Var1._M_head_impl =
           (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>
           .super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
      (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
      super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
      super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = (ChunkInfo *)_Var2._M_p;
      if (_Var1._M_head_impl != (ChunkInfo *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_ChunkInfo + 8))();
      }
      if ((ChunkInfo *)local_90._M_dataplus._M_p != (ChunkInfo *)0x0) {
        (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
      }
    }
    else {
      new_info.ptr = (ChunkVectorInfo *)0x0;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
               ::get<true>(this_00,uVar9);
      if ((pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
          _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
          _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
          super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl == (ChunkInfo *)0x0) {
        local_68 = this->start + lVar7;
        make_uniq<duckdb::ChunkVectorInfo,unsigned_long>((duckdb *)&local_90,&local_68);
        _Var2._M_p = local_90._M_dataplus._M_p;
        new_info.ptr = (ChunkVectorInfo *)local_90._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)0x0;
        pvVar4 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                 ::get<true>(this_00,uVar9);
        _Var1._M_head_impl =
             (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
             _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
             super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
        (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
        super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
        super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = (ChunkInfo *)_Var2._M_p;
        if (_Var1._M_head_impl != (ChunkInfo *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_ChunkInfo + 8))();
        }
        iVar6 = local_60;
        if ((ChunkInfo *)local_90._M_dataplus._M_p != (ChunkInfo *)0x0) {
          (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
          iVar6 = local_60;
        }
      }
      else {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                 ::get<true>(this_00,uVar9);
        pCVar5 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                 operator->(pvVar4);
        if (pCVar5->type != VECTOR_INFO) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_90,
                     "Error in RowVersionManager::AppendVersionInfo - expected either a ChunkVectorInfo or no version info"
                     ,(allocator *)&local_68);
          InternalException::InternalException(this_02,&local_90);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar4 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                 ::get<true>(this_00,uVar9);
        pCVar5 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                 operator->(pvVar4);
        new_info.ptr = ChunkInfo::Cast<duckdb::ChunkVectorInfo>(pCVar5);
      }
      this_01 = optional_ptr<duckdb::ChunkVectorInfo,_true>::operator->(&new_info);
      ChunkVectorInfo::Append(this_01,start,end,local_70);
    }
    lVar7 = lVar7 + 0x800;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void RowVersionManager::AppendVersionInfo(TransactionData transaction, idx_t count, idx_t row_group_start,
                                          idx_t row_group_end) {
	lock_guard<mutex> lock(version_lock);
	has_changes = true;
	idx_t start_vector_idx = row_group_start / STANDARD_VECTOR_SIZE;
	idx_t end_vector_idx = (row_group_end - 1) / STANDARD_VECTOR_SIZE;

	// fill-up vector_info
	FillVectorInfo(end_vector_idx);

	// insert the version info nodes
	for (idx_t vector_idx = start_vector_idx; vector_idx <= end_vector_idx; vector_idx++) {
		idx_t vector_start =
		    vector_idx == start_vector_idx ? row_group_start - start_vector_idx * STANDARD_VECTOR_SIZE : 0;
		idx_t vector_end =
		    vector_idx == end_vector_idx ? row_group_end - end_vector_idx * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		if (vector_start == 0 && vector_end == STANDARD_VECTOR_SIZE) {
			// entire vector is encapsulated by append: append a single constant
			auto constant_info = make_uniq<ChunkConstantInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
			constant_info->insert_id = transaction.transaction_id;
			constant_info->delete_id = NOT_DELETED_ID;
			vector_info[vector_idx] = std::move(constant_info);
		} else {
			// part of a vector is encapsulated: append to that part
			optional_ptr<ChunkVectorInfo> new_info;
			if (!vector_info[vector_idx]) {
				// first time appending to this vector: create new info
				auto insert_info = make_uniq<ChunkVectorInfo>(start + vector_idx * STANDARD_VECTOR_SIZE);
				new_info = insert_info.get();
				vector_info[vector_idx] = std::move(insert_info);
			} else if (vector_info[vector_idx]->type == ChunkInfoType::VECTOR_INFO) {
				// use existing vector
				new_info = &vector_info[vector_idx]->Cast<ChunkVectorInfo>();
			} else {
				throw InternalException("Error in RowVersionManager::AppendVersionInfo - expected either a "
				                        "ChunkVectorInfo or no version info");
			}
			new_info->Append(vector_start, vector_end, transaction.transaction_id);
		}
	}
}